

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fShaderLoopTests.cpp
# Opt level: O2

int __thiscall
deqp::gles2::Functional::ShaderLoopTests::init(ShaderLoopTests *this,EVP_PKEY_CTX *ctx)

{
  DataType dataType;
  char *__s;
  char *pcVar1;
  Context *pCVar2;
  int numIters;
  _Alloc_hider description;
  _Alloc_hider name_00;
  uint uVar3;
  uint uVar4;
  int extraout_EAX;
  TestCaseGroup *this_00;
  char *pcVar5;
  char *__rhs;
  char *pcVar6;
  ostream *poVar7;
  ostream *poVar8;
  ShaderLoopCase *pSVar9;
  ShaderEvalFunc evalFunc;
  LoopRequirement requirement;
  long lVar10;
  long lVar11;
  int i;
  char *pcVar12;
  LoopRequirement precision;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *ppVar13;
  string *this_01;
  string *psVar14;
  int numLoopIters;
  long local_5d8;
  long local_5d0;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  params;
  string loopBody;
  StringTemplate fragTemplate;
  string incrementStr;
  string iterMaxStr;
  string vertexShaderSource;
  string loopCountDeclStr;
  string initValue;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_470;
  string loopCmpStr;
  StringTemplate vertTemplate;
  string desc;
  string name;
  string groupDesc;
  string groupName;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_340;
  vector<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_> children;
  ostringstream frag;
  
  local_5d0 = 0;
  do {
    if (local_5d0 == 3) {
      pCVar2 = (this->super_TestCaseGroup).m_context;
      deqp::gls::ShaderLibrary::ShaderLibrary
                ((ShaderLibrary *)&frag,pCVar2->m_testCtx,pCVar2->m_renderCtx,pCVar2->m_contextInfo)
      ;
      deqp::gls::ShaderLibrary::loadShaderFile
                (&children,(ShaderLibrary *)&frag,"shaders/loops.test");
      deqp::gls::ShaderLibrary::~ShaderLibrary((ShaderLibrary *)&frag);
      for (lVar11 = 0;
          lVar11 < (int)((ulong)((long)children.
                                       super__Vector_base<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_>
                                       ._M_impl.super__Vector_impl_data._M_finish -
                                (long)children.
                                      super__Vector_base<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_>
                                      ._M_impl.super__Vector_impl_data._M_start) >> 3);
          lVar11 = lVar11 + 1) {
        tcu::TestNode::addChild
                  ((TestNode *)this,
                   children.super__Vector_base<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_>.
                   _M_impl.super__Vector_impl_data._M_start[lVar11]);
      }
      std::_Vector_base<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_>::~_Vector_base
                (&children.super__Vector_base<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_>);
      return extraout_EAX;
    }
    __s = *(char **)(getLoopTypeName(deqp::gles2::Functional::LoopType)::s_names + local_5d0 * 8);
    lVar11 = 0;
    while (lVar11 != 3) {
      pcVar1 = (char *)(&getLoopCountTypeName(deqp::gles2::Functional::LoopCountType)::s_names)
                       [lVar11];
      local_5d8 = lVar11;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&vertTemplate,__s,(allocator<char> *)&iterMaxStr);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&frag,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &vertTemplate,"_");
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&params,pcVar1,(allocator<char> *)&initValue);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&children,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&frag,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&params);
      std::operator+(&groupName,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&children,
                     "_iterations");
      std::__cxx11::string::~string((string *)&children);
      std::__cxx11::string::~string((string *)&params);
      std::__cxx11::string::~string((string *)&frag);
      std::__cxx11::string::~string((string *)&vertTemplate);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&frag,"Loop tests with ",(allocator<char> *)&vertTemplate);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&children,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&frag,
                     pcVar1);
      std::operator+(&groupDesc,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&children,
                     " loop counter.");
      std::__cxx11::string::~string((string *)&children);
      std::__cxx11::string::~string((string *)&frag);
      this_00 = (TestCaseGroup *)operator_new(0x78);
      TestCaseGroup::TestCaseGroup
                (this_00,(this->super_TestCaseGroup).m_context,groupName._M_dataplus._M_p,
                 groupDesc._M_dataplus._M_p);
      tcu::TestNode::addChild((TestNode *)this,(TestNode *)this_00);
      precision = LOOPREQUIREMENT_STANDARD;
      requirement = (local_5d8 != 1) + LOOPREQUIREMENT_UNIFORM;
      if (local_5d8 == 0) {
        requirement = precision;
      }
      uVar3 = (int)local_5d8 - 1;
      if (local_5d0 != 0) {
        requirement = LOOPREQUIREMENT_DYNAMIC;
      }
      for (; precision != LOOPREQUIREMENT_LAST; precision = precision + LOOPREQUIREMENT_UNIFORM) {
        pcVar5 = glu::getPrecisionName(precision);
        for (lVar11 = 0; lVar11 != 2; lVar11 = lVar11 + 1) {
          dataType = init::s_countDataType[lVar11];
          __rhs = glu::getDataTypeName(dataType);
          uVar4 = dataType - TYPE_INT;
          for (lVar10 = 0; lVar10 != 8; lVar10 = lVar10 + 4) {
            pcVar6 = glu::getShaderTypeName
                               (*(ShaderType *)
                                 ((long)UniformCase::randomFeatures(unsigned_int)::arrayUsageChoices
                                 + lVar10));
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&iterMaxStr,"basic_",(allocator<char> *)&initValue);
            std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &params,&iterMaxStr,pcVar5);
            std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &vertTemplate,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &params,"_");
            std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &frag,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)&vertTemplate,__rhs);
            std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &children,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &frag,"_");
            std::operator+(&name,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)&children,pcVar6);
            std::__cxx11::string::~string((string *)&children);
            std::__cxx11::string::~string((string *)&frag);
            std::__cxx11::string::~string((string *)&vertTemplate);
            std::__cxx11::string::~string((string *)&params);
            std::__cxx11::string::~string((string *)&iterMaxStr);
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&loopCmpStr,__s,(allocator<char> *)&incrementStr);
            std::operator+(&loopCountDeclStr,&loopCmpStr," loop with ");
            std::operator+(&initValue,&loopCountDeclStr,pcVar5);
            std::operator+(&iterMaxStr,&initValue,__rhs);
            std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &params,&iterMaxStr," ");
            std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &vertTemplate,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &params,pcVar1);
            std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &frag,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)&vertTemplate," iteration count in ");
            std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &children,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &frag,pcVar6);
            std::operator+(&desc,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)&children," shader.");
            std::__cxx11::string::~string((string *)&children);
            std::__cxx11::string::~string((string *)&frag);
            std::__cxx11::string::~string((string *)&vertTemplate);
            std::__cxx11::string::~string((string *)&params);
            std::__cxx11::string::~string((string *)&iterMaxStr);
            std::__cxx11::string::~string((string *)&initValue);
            std::__cxx11::string::~string((string *)&loopCountDeclStr);
            std::__cxx11::string::~string((string *)&loopCmpStr);
            name_00 = name._M_dataplus;
            description = desc._M_dataplus;
            pCVar2 = (this->super_TestCaseGroup).m_context;
            std::__cxx11::ostringstream::ostringstream((ostringstream *)&children);
            std::__cxx11::ostringstream::ostringstream((ostringstream *)&frag);
            psVar14 = (string *)&frag;
            if (lVar10 == 0) {
              psVar14 = (string *)&children;
            }
            std::operator<<((ostream *)&children,"attribute highp vec4 a_position;\n");
            std::operator<<((ostream *)&children,"attribute highp vec4 a_coords;\n");
            if (local_5d8 == 2) {
              std::operator<<((ostream *)&children,"attribute mediump float a_one;\n");
            }
            if (lVar10 == 0) {
              pcVar6 = "varying mediump vec3 v_color;\n";
              std::operator<<((ostream *)&children,"varying mediump vec3 v_color;\n");
LAB_0031dd24:
              std::operator<<((ostream *)&frag,pcVar6);
            }
            else {
              std::operator<<((ostream *)&children,"varying mediump vec4 v_coords;\n");
              std::operator<<((ostream *)&frag,"varying mediump vec4 v_coords;\n");
              if (local_5d8 == 2) {
                pcVar6 = "varying mediump float v_one;\n";
                std::operator<<((ostream *)&children,"varying mediump float v_one;\n");
                goto LAB_0031dd24;
              }
            }
            numLoopIters = 3;
            if (uVar4 < 4) {
              if (uVar3 < 2) {
                poVar7 = std::operator<<((ostream *)psVar14,"uniform ${COUNTER_PRECISION} int ");
                pcVar6 = deqp::gls::getIntUniformName(numLoopIters);
                poVar7 = std::operator<<(poVar7,pcVar6);
                pcVar6 = ";\n";
                goto LAB_0031ddd4;
              }
            }
            else {
              pcVar6 = "uniform ${COUNTER_PRECISION} float uf_one;\n";
              poVar7 = (ostream *)psVar14;
              if (uVar3 < 2) {
                poVar8 = std::operator<<((ostream *)psVar14,"uniform ${COUNTER_PRECISION} float ");
                pcVar6 = deqp::gls::getFloatFractionUniformName(numLoopIters);
                poVar8 = std::operator<<(poVar8,pcVar6);
                std::operator<<(poVar8,";\n");
                pcVar6 = "uniform ${COUNTER_PRECISION} float uf_one;\n";
                if (numLoopIters == 1) goto LAB_0031dddc;
              }
LAB_0031ddd4:
              std::operator<<(poVar7,pcVar6);
            }
LAB_0031dddc:
            std::operator<<((ostream *)&children,"\n");
            std::operator<<((ostream *)&children,"void main()\n");
            std::operator<<((ostream *)&children,"{\n");
            std::operator<<((ostream *)&children,"\tgl_Position = a_position;\n");
            std::operator<<((ostream *)&frag,"\n");
            std::operator<<((ostream *)&frag,"void main()\n");
            std::operator<<((ostream *)&frag,"{\n");
            pcVar6 = "\t${PRECISION} vec4 coords = v_coords;\n";
            if (lVar10 == 0) {
              pcVar6 = "\t${PRECISION} vec4 coords = a_coords;\n";
            }
            std::operator<<((ostream *)psVar14,pcVar6);
            if (local_5d8 == 2) {
              pcVar6 = "\t${COUNTER_PRECISION} int one = int(v_one + 0.5);\n";
              if (lVar10 == 0) {
                pcVar6 = "\t${COUNTER_PRECISION} int one = int(a_one + 0.5);\n";
              }
              pcVar12 = "\t${COUNTER_PRECISION} float one = v_one;\n";
              if (lVar10 == 0) {
                pcVar12 = "\t${COUNTER_PRECISION} float one = a_one;\n";
              }
              if (uVar4 < 4) {
                pcVar12 = pcVar6;
              }
              std::operator<<((ostream *)psVar14,pcVar12);
            }
            std::operator<<((ostream *)psVar14,"\t${PRECISION} vec4 res = coords;\n");
            iterMaxStr._M_string_length = 0;
            iterMaxStr._M_dataplus._M_p = (pointer)&iterMaxStr.field_2;
            iterMaxStr.field_2._M_local_buf[0] = '\0';
            if (uVar4 < 4) {
              if ((int)local_5d8 == 1) {
                deqp::gls::getIntUniformName(numLoopIters);
                std::__cxx11::string::assign((char *)&iterMaxStr);
                pcVar6 = "0";
              }
              else {
                if ((int)local_5d8 == 0) {
                  de::toString<int>((string *)&vertTemplate,&numLoopIters);
                  std::__cxx11::string::operator=((string *)&iterMaxStr,(string *)&vertTemplate);
                  ppVar13 = (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                             *)&vertTemplate;
                }
                else {
                  pcVar6 = "0";
                  if (local_5d8 != 2) goto LAB_0031e000;
                  pcVar6 = deqp::gls::getIntUniformName(numLoopIters);
                  ppVar13 = (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                             *)&params;
                  std::__cxx11::string::string<std::allocator<char>>
                            ((string *)ppVar13,pcVar6,(allocator<char> *)&initValue);
                  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)&vertTemplate,
                                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)ppVar13,"*one");
                  std::__cxx11::string::operator=((string *)&iterMaxStr,(string *)&vertTemplate);
                  std::__cxx11::string::~string((string *)&vertTemplate);
                }
                std::__cxx11::string::~string((string *)ppVar13);
                pcVar6 = "0";
              }
            }
            else if ((((int)local_5d8 == 0) || ((int)local_5d8 == 1)) ||
                    (pcVar6 = "0.05", local_5d8 == 2)) {
              std::__cxx11::string::assign((char *)&iterMaxStr);
              pcVar6 = "0.05";
            }
LAB_0031e000:
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&initValue,pcVar6,(allocator<char> *)&vertTemplate);
            std::operator+(&loopCountDeclStr,"${COUNTER_PRECISION} ${LOOP_VAR_TYPE} ndx = ",
                           &initValue);
            std::operator+(&loopCmpStr,"ndx < ",&iterMaxStr);
            incrementStr._M_string_length = 0;
            incrementStr._M_dataplus._M_p = (pointer)&incrementStr.field_2;
            incrementStr.field_2._M_local_buf[0] = '\0';
            if (uVar4 < 4) {
              std::__cxx11::string::assign((char *)&incrementStr);
            }
            else {
              if ((int)local_5d8 == 1) {
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&params,"ndx += ",(allocator<char> *)&loopBody);
                pcVar6 = deqp::gls::getFloatFractionUniformName(numLoopIters);
                std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               &vertTemplate,
                               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               &params,pcVar6);
                std::__cxx11::string::operator=((string *)&incrementStr,(string *)&vertTemplate);
                ppVar13 = (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                           *)&vertTemplate;
LAB_0031e156:
                this_01 = (string *)&params;
                std::__cxx11::string::~string((string *)ppVar13);
              }
              else {
                if ((int)local_5d8 == 0) {
                  std::__cxx11::string::string<std::allocator<char>>
                            ((string *)&params,"ndx += ",(allocator<char> *)&vertexShaderSource);
                  fragTemplate.m_template._M_dataplus._M_p._0_4_ = 1.0 / (float)numLoopIters;
                  de::toString<float>(&loopBody,(float *)&fragTemplate);
                  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)&vertTemplate,
                                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)&params,
                                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)&loopBody);
                  std::__cxx11::string::operator=((string *)&incrementStr,(string *)&vertTemplate);
                  std::__cxx11::string::~string((string *)&vertTemplate);
                  ppVar13 = (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                             *)&loopBody;
                  goto LAB_0031e156;
                }
                if (local_5d8 != 2) goto LAB_0031e163;
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&loopBody,"ndx += ",(allocator<char> *)&fragTemplate);
                pcVar6 = deqp::gls::getFloatFractionUniformName(numLoopIters);
                std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               &params,&loopBody,pcVar6);
                std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               &vertTemplate,
                               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               &params,"*one");
                std::__cxx11::string::operator=((string *)&incrementStr,(string *)&vertTemplate);
                std::__cxx11::string::~string((string *)&vertTemplate);
                std::__cxx11::string::~string((string *)&params);
                this_01 = &loopBody;
              }
              std::__cxx11::string::~string((string *)this_01);
            }
LAB_0031e163:
            loopBody._M_dataplus._M_p = (pointer)&loopBody.field_2;
            loopBody._M_string_length = 0;
            loopBody.field_2._M_local_buf[0] = '\0';
            std::__cxx11::string::assign((char *)&loopBody);
            if (local_5d0 == 0) {
              std::operator+(&local_340,"\tfor (",&loopCountDeclStr);
              std::operator+(&local_470,&local_340,"; ");
              std::operator+(&vertexShaderSource,&local_470,&loopCmpStr);
              std::operator+(&fragTemplate.m_template,&vertexShaderSource,"; ");
              std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             &params,&fragTemplate.m_template,&incrementStr);
              std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             &vertTemplate,
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             &params,")\n");
              std::operator<<((ostream *)psVar14,(string *)&vertTemplate);
              std::__cxx11::string::~string((string *)&vertTemplate);
              std::__cxx11::string::~string((string *)&params);
              std::__cxx11::string::~string((string *)&fragTemplate);
              std::__cxx11::string::~string((string *)&vertexShaderSource);
              std::__cxx11::string::~string((string *)&local_470);
              std::__cxx11::string::~string((string *)&local_340);
              std::operator<<((ostream *)psVar14,"\t{\n");
              std::operator<<((ostream *)psVar14,(string *)&loopBody);
LAB_0031e3ac:
              std::operator<<((ostream *)psVar14,"\t}\n");
            }
            else if ((int)local_5d0 == 2) {
              poVar7 = std::operator<<((ostream *)psVar14,"\t");
              std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             &vertTemplate,&loopCountDeclStr,";\n");
              std::operator<<(poVar7,(string *)&vertTemplate);
              std::__cxx11::string::~string((string *)&vertTemplate);
              std::operator<<((ostream *)psVar14,"\tdo\n");
              std::operator<<((ostream *)psVar14,"\t{\n");
              std::operator<<((ostream *)psVar14,(string *)&loopBody);
              std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             &params,"\t\t",&incrementStr);
              std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             &vertTemplate,
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             &params,";\n");
              std::operator<<((ostream *)psVar14,(string *)&vertTemplate);
              std::__cxx11::string::~string((string *)&vertTemplate);
              std::__cxx11::string::~string((string *)&params);
              std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             &params,"\t} while (",&loopCmpStr);
              std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             &vertTemplate,
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             &params,");\n");
              std::operator<<((ostream *)psVar14,(string *)&vertTemplate);
              std::__cxx11::string::~string((string *)&vertTemplate);
              std::__cxx11::string::~string((string *)&params);
            }
            else if ((int)local_5d0 == 1) {
              poVar7 = std::operator<<((ostream *)psVar14,"\t");
              std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             &vertTemplate,&loopCountDeclStr,";\n");
              std::operator<<(poVar7,(string *)&vertTemplate);
              std::__cxx11::string::~string((string *)&vertTemplate);
              std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             &params,"\twhile (",&loopCmpStr);
              std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             &vertTemplate,
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             &params,")\n");
              std::operator<<((ostream *)psVar14,(string *)&vertTemplate);
              std::__cxx11::string::~string((string *)&vertTemplate);
              std::__cxx11::string::~string((string *)&params);
              std::operator<<((ostream *)psVar14,"\t{\n");
              std::operator<<((ostream *)psVar14,(string *)&loopBody);
              std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             &params,"\t\t",&incrementStr);
              std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             &vertTemplate,
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             &params,";\n");
              std::operator<<((ostream *)psVar14,(string *)&vertTemplate);
              std::__cxx11::string::~string((string *)&vertTemplate);
              std::__cxx11::string::~string((string *)&params);
              goto LAB_0031e3ac;
            }
            if (lVar10 == 0) {
              std::operator<<((ostream *)&children,"\tv_color = res.rgb;\n");
              poVar7 = (ostream *)&frag;
              pcVar6 = "\tgl_FragColor = vec4(v_color.rgb, 1.0);\n";
LAB_0031e524:
              std::operator<<(poVar7,pcVar6);
            }
            else {
              std::operator<<((ostream *)&children,"\tv_coords = a_coords;\n");
              std::operator<<((ostream *)&frag,"\tgl_FragColor = vec4(res.rgb, 1.0);\n");
              poVar7 = (ostream *)&children;
              pcVar6 = "\tv_one = a_one;\n";
              if (local_5d8 == 2) goto LAB_0031e524;
            }
            std::operator<<((ostream *)&children,"}\n");
            std::operator<<((ostream *)&frag,"}\n");
            params._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
            params._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
            params._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
                 &params._M_t._M_impl.super__Rb_tree_header._M_header;
            params._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
            params._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
                 params._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
            fragTemplate.m_template._M_dataplus._M_p = glu::getDataTypeName(dataType);
            std::
            pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::pair<const_char_(&)[14],_const_char_*,_true>
                      ((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)&vertTemplate,(char (*) [14])"LOOP_VAR_TYPE",(char **)&fragTemplate);
            std::
            _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
            ::_M_emplace_unique<std::pair<std::__cxx11::string,std::__cxx11::string>>
                      ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                        *)&params,
                       (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)&vertTemplate);
            std::
            pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::~pair((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)&vertTemplate);
            std::
            pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::pair<const_char_(&)[10],_const_char_(&)[8],_true>
                      ((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)&vertTemplate,(char (*) [10])0x5ecaae,(char (*) [8])0x5b7746);
            std::
            _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
            ::_M_emplace_unique<std::pair<std::__cxx11::string,std::__cxx11::string>>
                      ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                        *)&params,
                       (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)&vertTemplate);
            std::
            pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::~pair((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)&vertTemplate);
            fragTemplate.m_template._M_dataplus._M_p = glu::getPrecisionName(precision);
            std::
            pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::pair<const_char_(&)[18],_const_char_*,_true>
                      ((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)&vertTemplate,(char (*) [18])"COUNTER_PRECISION",(char **)&fragTemplate);
            std::
            _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
            ::_M_emplace_unique<std::pair<std::__cxx11::string,std::__cxx11::string>>
                      ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                        *)&params,
                       (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)&vertTemplate);
            std::
            pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::~pair((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)&vertTemplate);
            std::__cxx11::stringbuf::str();
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&fragTemplate.m_template,vertexShaderSource._M_dataplus._M_p,
                       (allocator<char> *)&local_470);
            tcu::StringTemplate::StringTemplate(&vertTemplate,&fragTemplate.m_template);
            std::__cxx11::string::~string((string *)&fragTemplate.m_template);
            std::__cxx11::string::~string((string *)&vertexShaderSource);
            std::__cxx11::stringbuf::str();
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&vertexShaderSource,local_470._M_dataplus._M_p,
                       (allocator<char> *)&local_340);
            tcu::StringTemplate::StringTemplate(&fragTemplate,&vertexShaderSource);
            std::__cxx11::string::~string((string *)&vertexShaderSource);
            std::__cxx11::string::~string((string *)&local_470);
            tcu::StringTemplate::specialize(&vertexShaderSource,&vertTemplate,&params);
            tcu::StringTemplate::specialize(&local_470,&fragTemplate,&params);
            numIters = numLoopIters;
            pSVar9 = (ShaderLoopCase *)operator_new(0x130);
            evalFunc = getLoopEvalFunc(numIters);
            ShaderLoopCase::ShaderLoopCase
                      (pSVar9,pCVar2,name_00._M_p,description._M_p,lVar10 == 0,evalFunc,requirement,
                       vertexShaderSource._M_dataplus._M_p,local_470._M_dataplus._M_p);
            std::__cxx11::string::~string((string *)&local_470);
            std::__cxx11::string::~string((string *)&vertexShaderSource);
            tcu::StringTemplate::~StringTemplate(&fragTemplate);
            tcu::StringTemplate::~StringTemplate(&vertTemplate);
            std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::~_Rb_tree(&params._M_t);
            std::__cxx11::string::~string((string *)&loopBody);
            std::__cxx11::string::~string((string *)&incrementStr);
            std::__cxx11::string::~string((string *)&loopCmpStr);
            std::__cxx11::string::~string((string *)&loopCountDeclStr);
            std::__cxx11::string::~string((string *)&initValue);
            std::__cxx11::string::~string((string *)&iterMaxStr);
            std::__cxx11::ostringstream::~ostringstream((ostringstream *)&frag);
            std::__cxx11::ostringstream::~ostringstream((ostringstream *)&children);
            tcu::TestNode::addChild((TestNode *)this_00,(TestNode *)pSVar9);
            std::__cxx11::string::~string((string *)&desc);
            std::__cxx11::string::~string((string *)&name);
          }
        }
      }
      for (lVar11 = 0; lVar11 != 0x1d; lVar11 = lVar11 + 1) {
        if (lVar11 != 7 || local_5d0 != 2) {
          pcVar1 = *(char **)(getLoopCaseName(deqp::gles2::Functional::LoopCase)::s_names +
                             lVar11 * 8);
          for (lVar10 = 0; lVar10 != 8; lVar10 = lVar10 + 4) {
            pcVar5 = glu::getShaderTypeName
                               (*(ShaderType *)
                                 ((long)UniformCase::randomFeatures(unsigned_int)::arrayUsageChoices
                                 + lVar10));
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&vertTemplate,pcVar1,(allocator<char> *)&params);
            std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &frag,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)&vertTemplate,"_");
            std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &children,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &frag,pcVar5);
            std::__cxx11::string::~string((string *)&frag);
            std::__cxx11::string::~string((string *)&vertTemplate);
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&loopCountDeclStr,pcVar1,(allocator<char> *)&loopCmpStr);
            std::operator+(&initValue,&loopCountDeclStr," loop with ");
            std::operator+(&iterMaxStr,&initValue,__s);
            std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &params,&iterMaxStr," iteration count in ");
            std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &vertTemplate,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &params,pcVar5);
            std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &frag,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)&vertTemplate," shader.");
            std::__cxx11::string::~string((string *)&vertTemplate);
            std::__cxx11::string::~string((string *)&params);
            std::__cxx11::string::~string((string *)&iterMaxStr);
            std::__cxx11::string::~string((string *)&initValue);
            std::__cxx11::string::~string((string *)&loopCountDeclStr);
            pSVar9 = createSpecialLoopCase
                               ((this->super_TestCaseGroup).m_context,
                                (char *)children.
                                        super__Vector_base<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_>
                                        ._M_impl.super__Vector_impl_data._M_start,_frag,lVar10 == 0,
                                (LoopCase)lVar11,(LoopType)local_5d0,(LoopCountType)local_5d8);
            tcu::TestNode::addChild((TestNode *)this_00,(TestNode *)pSVar9);
            std::__cxx11::string::~string((string *)&frag);
            std::__cxx11::string::~string((string *)&children);
          }
        }
      }
      std::__cxx11::string::~string((string *)&groupDesc);
      std::__cxx11::string::~string((string *)&groupName);
      lVar11 = local_5d8 + 1;
    }
    local_5d0 = local_5d0 + 1;
  } while( true );
}

Assistant:

void ShaderLoopTests::init (void)
{
	// Loop cases.

	static const ShaderType s_shaderTypes[] =
	{
		SHADERTYPE_VERTEX,
		SHADERTYPE_FRAGMENT
	};

	static const DataType s_countDataType[] =
	{
		TYPE_INT,
		TYPE_FLOAT
	};

	for (int loopType = 0; loopType < LOOPTYPE_LAST; loopType++)
	{
		const char* loopTypeName = getLoopTypeName((LoopType)loopType);

		for (int loopCountType = 0; loopCountType < LOOPCOUNT_LAST; loopCountType++)
		{
			const char* loopCountName = getLoopCountTypeName((LoopCountType)loopCountType);

			string groupName = string(loopTypeName) + "_" + string(loopCountName) + "_iterations";
			string groupDesc = string("Loop tests with ") + loopCountName + " loop counter.";
			TestCaseGroup* group = new TestCaseGroup(m_context, groupName.c_str(), groupDesc.c_str());
			addChild(group);

			// Generic cases.

			for (int precision = 0; precision < PRECISION_LAST; precision++)
			{
				const char* precisionName = getPrecisionName((Precision)precision);

				for (int dataTypeNdx = 0; dataTypeNdx < DE_LENGTH_OF_ARRAY(s_countDataType); dataTypeNdx++)
				{
					DataType loopDataType = s_countDataType[dataTypeNdx];
					const char* dataTypeName = getDataTypeName(loopDataType);

					for (int shaderTypeNdx = 0; shaderTypeNdx < DE_LENGTH_OF_ARRAY(s_shaderTypes); shaderTypeNdx++)
					{
						ShaderType	shaderType		= s_shaderTypes[shaderTypeNdx];
						const char*	shaderTypeName	= getShaderTypeName(shaderType);
						bool		isVertexCase	= (shaderType == SHADERTYPE_VERTEX);

						string name = string("basic_") + precisionName + "_" + dataTypeName + "_" + shaderTypeName;
						string desc = string(loopTypeName) + " loop with " + precisionName + dataTypeName + " " + loopCountName + " iteration count in " + shaderTypeName + " shader.";
						group->addChild(createGenericLoopCase(m_context, name.c_str(), desc.c_str(), isVertexCase, (LoopType)loopType, (LoopCountType)loopCountType, (Precision)precision, loopDataType));
					}
				}
			}

			// Special cases.

			for (int loopCase = 0; loopCase < LOOPCASE_LAST; loopCase++)
			{
				const char* loopCaseName = getLoopCaseName((LoopCase)loopCase);

				// no-iterations not possible with do-while.
				if ((loopCase == LOOPCASE_NO_ITERATIONS) && (loopType == LOOPTYPE_DO_WHILE))
					continue;

				for (int shaderTypeNdx = 0; shaderTypeNdx < DE_LENGTH_OF_ARRAY(s_shaderTypes); shaderTypeNdx++)
				{
					ShaderType	shaderType		= s_shaderTypes[shaderTypeNdx];
					const char*	shaderTypeName	= getShaderTypeName(shaderType);
					bool		isVertexCase	= (shaderType == SHADERTYPE_VERTEX);

					string name = string(loopCaseName) + "_" + shaderTypeName;
					string desc = string(loopCaseName) + " loop with " + loopTypeName + " iteration count in " + shaderTypeName + " shader.";
					group->addChild(createSpecialLoopCase(m_context, name.c_str(), desc.c_str(), isVertexCase, (LoopCase)loopCase, (LoopType)loopType, (LoopCountType)loopCountType));
				}
			}
		}
	}

	// Additional smaller handwritten tests.
	const std::vector<tcu::TestNode*> children = gls::ShaderLibrary(m_context.getTestContext(), m_context.getRenderContext(), m_context.getContextInfo()).loadShaderFile("shaders/loops.test");
	for (int i = 0; i < (int)children.size(); i++)
		addChild(children[i]);
}